

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

TestCaseGroup * vkt::SpirVAssembly::anon_unknown_5::createOpAtomicGroup(TestContext *testCtx)

{
  vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
  *this;
  allocator<int> *this_00;
  int iVar1;
  _func_void_deInt32_ptr_deInt32 *p_Var2;
  undefined8 testCtx_00;
  deUint32 seed;
  deBool dVar3;
  TestCaseGroup *pTVar4;
  TestNode *pTVar5;
  char *pcVar6;
  size_type sVar7;
  reference pvVar8;
  mapped_type *pmVar9;
  reference pvVar10;
  Buffer<int> *pBVar11;
  SpvAsmComputeShaderCase *this_01;
  deInt32 *local_4a0;
  pointer local_3f4;
  int local_3ec;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_3e8;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_3d8;
  ulong local_3c8;
  size_t ndx;
  allocator<char> local_399;
  key_type local_398;
  allocator<char> local_371;
  key_type local_370;
  allocator<int> local_34d;
  value_type_conflict1 local_34c;
  undefined1 local_348 [8];
  vector<int,_std::allocator<int>_> expected;
  undefined1 local_328 [8];
  vector<int,_std::allocator<int>_> inputInts;
  ComputeShaderSpec spec;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  specializations;
  size_t caseNdx;
  OpAtomicCase local_1f0;
  OpAtomicCase local_1d0;
  OpAtomicCase local_1b0;
  OpAtomicCase local_190;
  OpAtomicCase local_170;
  OpAtomicCase local_150;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  StringTemplate shaderTemplate;
  vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
  cases;
  undefined1 local_40 [4];
  int numElements;
  Random rnd;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  TestContext *testCtx_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
       testCtx;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(TestContext *)
                    group.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"opatomic","Test the OpAtomic* opcodes");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&rnd.m_rnd.z + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar4
            );
  pTVar5 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pcVar6 = tcu::TestNode::getName(pTVar5);
  seed = deStringHash(pcVar6);
  de::Random::Random((Random *)local_40,seed);
  std::
  vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
  ::vector((vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
            *)((long)&shaderTemplate.m_template.field_2 + 8));
  pcVar6 = getComputeAsmShaderPreamble();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,pcVar6,&local_101);
  std::operator+(&local_e0,&local_100,
                 "OpSource GLSL 430\nOpName %main           \"main\"\nOpName %id             \"gl_GlobalInvocationID\"\nOpDecorate %id BuiltIn GlobalInvocationId\nOpDecorate %buf BufferBlock\nOpDecorate %indata DescriptorSet 0\nOpDecorate %indata Binding 0\nOpDecorate %i32arr ArrayStride 4\nOpMemberDecorate %buf 0 Offset 0\nOpDecorate %sumbuf BufferBlock\nOpDecorate %sum DescriptorSet 0\nOpDecorate %sum Binding 1\nOpMemberDecorate %sumbuf 0 Coherent\nOpMemberDecorate %sumbuf 0 Offset 0\n"
                );
  pcVar6 = getComputeAsmCommonTypes();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,pcVar6,&local_129);
  std::operator+(&local_c0,&local_e0,&local_128);
  std::operator+(&local_a0,&local_c0,
                 "%buf       = OpTypeStruct %i32arr\n%bufptr    = OpTypePointer Uniform %buf\n%indata    = OpVariable %bufptr Uniform\n%sumbuf    = OpTypeStruct %i32arr\n%sumbufptr = OpTypePointer Uniform %sumbuf\n%sum       = OpVariable %sumbufptr Uniform\n%id        = OpVariable %uvec3ptr Input\n%minusone  = OpConstant %i32 -1\n%zero      = OpConstant %i32 0\n%one       = OpConstant %u32 1\n%two       = OpConstant %i32 2\n%main      = OpFunction %void None %voidf\n%label     = OpLabel\n%idval     = OpLoad %uvec3 %id\n%x         = OpCompositeExtract %u32 %idval 0\n%inloc     = OpAccessChain %i32ptr %indata %zero %x\n%inval     = OpLoad %i32 %inloc\n%outloc    = OpAccessChain %i32ptr %sum %zero ${INDEX}\n${INSTRUCTION}             OpReturn\n             OpFunctionEnd\n"
                );
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  do {
    OpAtomicCase::OpAtomicCase
              (&local_150,"iadd","%unused    = OpAtomicIAdd %i32 %outloc %one %zero %inval\n",
               createOpAtomicGroup::calculateExpected_iadd::calculateExpected,1);
    std::
    vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
    ::push_back((vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
                 *)((long)&shaderTemplate.m_template.field_2 + 8),&local_150);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    OpAtomicCase::OpAtomicCase
              (&local_170,"isub","%unused    = OpAtomicISub %i32 %outloc %one %zero %inval\n",
               createOpAtomicGroup::calculateExpected_isub::calculateExpected,1);
    std::
    vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
    ::push_back((vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
                 *)((long)&shaderTemplate.m_template.field_2 + 8),&local_170);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    OpAtomicCase::OpAtomicCase
              (&local_190,"iinc","%unused    = OpAtomicIIncrement %i32 %outloc %one %zero\n",
               createOpAtomicGroup::calculateExpected_iinc::calculateExpected,1);
    std::
    vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
    ::push_back((vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
                 *)((long)&shaderTemplate.m_template.field_2 + 8),&local_190);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    OpAtomicCase::OpAtomicCase
              (&local_1b0,"idec","%unused    = OpAtomicIDecrement %i32 %outloc %one %zero\n",
               createOpAtomicGroup::calculateExpected_idec::calculateExpected,1);
    std::
    vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
    ::push_back((vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
                 *)((long)&shaderTemplate.m_template.field_2 + 8),&local_1b0);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    OpAtomicCase::OpAtomicCase
              (&local_1d0,"load",
               "%inval2    = OpAtomicLoad %i32 %inloc %zero %zero\n             OpStore %outloc %inval2\n"
               ,createOpAtomicGroup::calculateExpected_load::calculateExpected,1000000);
    std::
    vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
    ::push_back((vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
                 *)((long)&shaderTemplate.m_template.field_2 + 8),&local_1d0);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    OpAtomicCase::OpAtomicCase
              (&local_1f0,"store","             OpAtomicStore %outloc %zero %zero %inval\n",
               createOpAtomicGroup::calculateExpected_store::calculateExpected,1000000);
    std::
    vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
    ::push_back((vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
                 *)((long)&shaderTemplate.m_template.field_2 + 8),&local_1f0);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    OpAtomicCase::OpAtomicCase
              ((OpAtomicCase *)&caseNdx,"compex",
               "%even      = OpSMod %i32 %inval %two\n             OpStore %outloc %even\n%unused    = OpAtomicCompareExchange %i32 %outloc %one %zero %zero %minusone %zero\n"
               ,createOpAtomicGroup::calculateExpected_compex::calculateExpected,1000000);
    std::
    vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
    ::push_back((vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
                 *)((long)&shaderTemplate.m_template.field_2 + 8),(value_type *)&caseNdx);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  for (specializations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      sVar7 = std::
              vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
              ::size((vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
                      *)((long)&shaderTemplate.m_template.field_2 + 8)),
      specializations._M_t._M_impl.super__Rb_tree_header._M_node_count < sVar7;
      specializations._M_t._M_impl.super__Rb_tree_header._M_node_count =
           specializations._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&spec.verifyIO);
    ComputeShaderSpec::ComputeShaderSpec
              ((ComputeShaderSpec *)
               &inputInts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    this_00 = (allocator<int> *)
              ((long)&expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 3);
    std::allocator<int>::allocator(this_00);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_328,1000000,
               (value_type_conflict1 *)
               ((long)&expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),this_00);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 3));
    pvVar8 = std::
             vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
             ::operator[]((vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
                           *)((long)&shaderTemplate.m_template.field_2 + 8),
                          specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    iVar1 = pvVar8->numOutputElements;
    local_34c = -1;
    std::allocator<int>::allocator(&local_34d);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_348,(long)iVar1,&local_34c,&local_34d);
    std::allocator<int>::~allocator(&local_34d);
    pvVar8 = std::
             vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
             ::operator[]((vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
                           *)((long)&shaderTemplate.m_template.field_2 + 8),
                          specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pcVar6 = "%x";
    if (pvVar8->numOutputElements == 1) {
      pcVar6 = "%zero";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"INDEX",&local_371);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&spec.verifyIO,&local_370);
    std::__cxx11::string::operator=((string *)pmVar9,pcVar6);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
    pvVar8 = std::
             vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
             ::operator[]((vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
                           *)((long)&shaderTemplate.m_template.field_2 + 8),
                          specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pcVar6 = pvVar8->assembly;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,"INSTRUCTION",&local_399);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&spec.verifyIO,&local_398);
    std::__cxx11::string::operator=((string *)pmVar9,pcVar6);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator(&local_399);
    tcu::StringTemplate::specialize
              ((string *)&ndx,(StringTemplate *)local_80,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&spec.verifyIO);
    std::__cxx11::string::operator=
              ((string *)
               &inputInts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(string *)&ndx);
    std::__cxx11::string::~string((string *)&ndx);
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_328,0);
    fillRandomScalars<int>((Random *)local_40,1,100,pvVar10,1000000,0);
    for (local_3c8 = 0; local_3c8 < 1000000; local_3c8 = local_3c8 + 1) {
      pvVar8 = std::
               vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
               ::operator[]((vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
                             *)((long)&shaderTemplate.m_template.field_2 + 8),
                            specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
      p_Var2 = pvVar8->calculateExpected;
      pvVar8 = std::
               vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
               ::operator[]((vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
                             *)((long)&shaderTemplate.m_template.field_2 + 8),
                            specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (pvVar8->numOutputElements == 1) {
        local_4a0 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_348,0);
      }
      else {
        local_4a0 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_348,local_3c8);
      }
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_328,local_3c8);
      (*p_Var2)(local_4a0,*pvVar10);
    }
    pBVar11 = (Buffer<int> *)operator_new(0x20);
    Buffer<int>::Buffer(pBVar11,(vector<int,_std::allocator<int>_> *)local_328);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
              (&local_3d8,(BufferInterface *)pBVar11);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                 *)((long)&spec.entryPoint.field_2 + 8),&local_3d8);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_3d8);
    pBVar11 = (Buffer<int> *)operator_new(0x20);
    Buffer<int>::Buffer(pBVar11,(vector<int,_std::allocator<int>_> *)local_348);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
              (&local_3e8,(BufferInterface *)pBVar11);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                 *)&spec.inputs.
                    super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_3e8);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_3e8);
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&local_3f4,1000000,1,1);
    spec.numWorkGroups.m_data[0] = local_3ec;
    spec.outputs.
    super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_3f4;
    pTVar5 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_20)->super_TestNode;
    this_01 = (SpvAsmComputeShaderCase *)operator_new(0x140);
    testCtx_00 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                 .m_data._8_8_;
    this = (vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
            *)((long)&shaderTemplate.m_template.field_2 + 8);
    pvVar8 = std::
             vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
             ::operator[](this,specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pcVar6 = pvVar8->name;
    pvVar8 = std::
             vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
             ::operator[](this,specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
              (this_01,(TestContext *)testCtx_00,pcVar6,pvVar8->name,
               (ComputeShaderSpec *)
               &inputInts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,COMPUTE_TEST_USES_NONE);
    tcu::TestNode::addChild(pTVar5,(TestNode *)this_01);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_348);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_328);
    ComputeShaderSpec::~ComputeShaderSpec
              ((ComputeShaderSpec *)
               &inputInts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&spec.verifyIO);
  }
  pTVar4 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_80);
  std::
  vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
  ::~vector((vector<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::OpAtomicCase>_>
             *)((long)&shaderTemplate.m_template.field_2 + 8));
  de::Random::~Random((Random *)local_40);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar4;
}

Assistant:

tcu::TestCaseGroup* createOpAtomicGroup (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	group			(new tcu::TestCaseGroup(testCtx, "opatomic", "Test the OpAtomic* opcodes"));
	de::Random						rnd				(deStringHash(group->getName()));
	const int						numElements		= 1000000;
	vector<OpAtomicCase>			cases;

	const StringTemplate			shaderTemplate	(

		string(getComputeAsmShaderPreamble()) +

		"OpSource GLSL 430\n"
		"OpName %main           \"main\"\n"
		"OpName %id             \"gl_GlobalInvocationID\"\n"

		"OpDecorate %id BuiltIn GlobalInvocationId\n"

		"OpDecorate %buf BufferBlock\n"
		"OpDecorate %indata DescriptorSet 0\n"
		"OpDecorate %indata Binding 0\n"
		"OpDecorate %i32arr ArrayStride 4\n"
		"OpMemberDecorate %buf 0 Offset 0\n"

		"OpDecorate %sumbuf BufferBlock\n"
		"OpDecorate %sum DescriptorSet 0\n"
		"OpDecorate %sum Binding 1\n"
		"OpMemberDecorate %sumbuf 0 Coherent\n"
		"OpMemberDecorate %sumbuf 0 Offset 0\n"

		+ string(getComputeAsmCommonTypes()) +

		"%buf       = OpTypeStruct %i32arr\n"
		"%bufptr    = OpTypePointer Uniform %buf\n"
		"%indata    = OpVariable %bufptr Uniform\n"

		"%sumbuf    = OpTypeStruct %i32arr\n"
		"%sumbufptr = OpTypePointer Uniform %sumbuf\n"
		"%sum       = OpVariable %sumbufptr Uniform\n"

		"%id        = OpVariable %uvec3ptr Input\n"
		"%minusone  = OpConstant %i32 -1\n"
		"%zero      = OpConstant %i32 0\n"
		"%one       = OpConstant %u32 1\n"
		"%two       = OpConstant %i32 2\n"

		"%main      = OpFunction %void None %voidf\n"
		"%label     = OpLabel\n"
		"%idval     = OpLoad %uvec3 %id\n"
		"%x         = OpCompositeExtract %u32 %idval 0\n"

		"%inloc     = OpAccessChain %i32ptr %indata %zero %x\n"
		"%inval     = OpLoad %i32 %inloc\n"

		"%outloc    = OpAccessChain %i32ptr %sum %zero ${INDEX}\n"
		"${INSTRUCTION}"

		"             OpReturn\n"
		"             OpFunctionEnd\n");

	#define ADD_OPATOMIC_CASE(NAME, ASSEMBLY, CALCULATE_EXPECTED, NUM_OUTPUT_ELEMENTS) \
	do { \
		DE_STATIC_ASSERT((NUM_OUTPUT_ELEMENTS) == 1 || (NUM_OUTPUT_ELEMENTS) == numElements); \
		struct calculateExpected_##NAME { static void calculateExpected(deInt32& expected, deInt32 input) CALCULATE_EXPECTED }; /* NOLINT(CALCULATE_EXPECTED) */ \
		cases.push_back(OpAtomicCase(#NAME, ASSEMBLY, calculateExpected_##NAME::calculateExpected, NUM_OUTPUT_ELEMENTS)); \
	} while (deGetFalse())
	#define ADD_OPATOMIC_CASE_1(NAME, ASSEMBLY, CALCULATE_EXPECTED) ADD_OPATOMIC_CASE(NAME, ASSEMBLY, CALCULATE_EXPECTED, 1)
	#define ADD_OPATOMIC_CASE_N(NAME, ASSEMBLY, CALCULATE_EXPECTED) ADD_OPATOMIC_CASE(NAME, ASSEMBLY, CALCULATE_EXPECTED, numElements)

	ADD_OPATOMIC_CASE_1(iadd,	"%unused    = OpAtomicIAdd %i32 %outloc %one %zero %inval\n", { expected += input; } );
	ADD_OPATOMIC_CASE_1(isub,	"%unused    = OpAtomicISub %i32 %outloc %one %zero %inval\n", { expected -= input; } );
	ADD_OPATOMIC_CASE_1(iinc,	"%unused    = OpAtomicIIncrement %i32 %outloc %one %zero\n",  { ++expected; (void)input;} );
	ADD_OPATOMIC_CASE_1(idec,	"%unused    = OpAtomicIDecrement %i32 %outloc %one %zero\n",  { --expected; (void)input;} );
	ADD_OPATOMIC_CASE_N(load,	"%inval2    = OpAtomicLoad %i32 %inloc %zero %zero\n"
								"             OpStore %outloc %inval2\n",  { expected = input;} );
	ADD_OPATOMIC_CASE_N(store,	"             OpAtomicStore %outloc %zero %zero %inval\n",  { expected = input;} );
	ADD_OPATOMIC_CASE_N(compex, "%even      = OpSMod %i32 %inval %two\n"
								"             OpStore %outloc %even\n"
								"%unused    = OpAtomicCompareExchange %i32 %outloc %one %zero %zero %minusone %zero\n",  { expected = (input % 2) == 0 ? -1 : 1;} );

	#undef ADD_OPATOMIC_CASE
	#undef ADD_OPATOMIC_CASE_1
	#undef ADD_OPATOMIC_CASE_N

	for (size_t caseNdx = 0; caseNdx < cases.size(); ++caseNdx)
	{
		map<string, string>			specializations;
		ComputeShaderSpec			spec;
		vector<deInt32>				inputInts		(numElements, 0);
		vector<deInt32>				expected		(cases[caseNdx].numOutputElements, -1);

		specializations["INDEX"]		= (cases[caseNdx].numOutputElements == 1) ? "%zero" : "%x";
		specializations["INSTRUCTION"]	= cases[caseNdx].assembly;
		spec.assembly					= shaderTemplate.specialize(specializations);

		fillRandomScalars(rnd, 1, 100, &inputInts[0], numElements);
		for (size_t ndx = 0; ndx < numElements; ++ndx)
		{
			cases[caseNdx].calculateExpected((cases[caseNdx].numOutputElements == 1) ? expected[0] : expected[ndx], inputInts[ndx]);
		}

		spec.inputs.push_back(BufferSp(new Int32Buffer(inputInts)));
		spec.outputs.push_back(BufferSp(new Int32Buffer(expected)));
		spec.numWorkGroups = IVec3(numElements, 1, 1);
		group->addChild(new SpvAsmComputeShaderCase(testCtx, cases[caseNdx].name, cases[caseNdx].name, spec));
	}

	return group.release();
}